

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O0

void __thiscall UniValue::UniValue(UniValue *this,int val_)

{
  long in_RDI;
  UniValue *this_00;
  int in_stack_ffffffffffffffbc;
  
  this_00 = (UniValue *)(in_RDI + 8);
  std::__cxx11::string::string((string *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x6c34f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(in_RDI + 0x40));
  setInt(this_00,in_stack_ffffffffffffffbc);
  return;
}

Assistant:

UniValue(int val_) {
        setInt(val_);
    }